

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O1

int read_word(char *str,char *word,int word_size)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  for (uVar4 = 0; (bVar1 = str[uVar4], bVar1 - 9 < 2 || (bVar1 == 0x20)); uVar4 = uVar4 + 1) {
  }
  if (bVar1 == 0) {
    iVar2 = (int)uVar4;
  }
  else {
    lVar6 = 0;
    uVar3 = uVar4 & 0xffffffff;
    while( true ) {
      iVar2 = (int)uVar3;
      bVar1 = str[uVar4 + lVar6];
      iVar5 = (int)lVar6;
      if (((ulong)bVar1 < 0x21) && ((0x100000601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        if (word == (char *)0x0) {
          return iVar2;
        }
        word = word + (int)(iVar5 - (uint)(word_size <= iVar5));
        goto LAB_001038af;
      }
      if (word_size <= lVar6 && word != (char *)0x0) break;
      if (word != (char *)0x0) {
        word[lVar6] = bVar1;
      }
      lVar6 = lVar6 + 1;
      uVar3 = (ulong)(iVar2 + 1);
    }
    if (word_size < 1) {
      return iVar5;
    }
    word = word + ((ulong)(uint)word_size - 1);
    iVar2 = iVar5;
  }
LAB_001038af:
  *word = '\0';
  return iVar2;
}

Assistant:

static int read_word(char *str, char *word, int word_size) 
{
   int word_cur = 0;
   int len = 0;
   while (*str == ' ' || *str == '\t' || *str == '\n') {
      str++;
      len++;
   }
   if (*str == '\0') {
      *word = '\0';
      return len;
   }
   while (*str != ' ' && *str != '\t' && *str != '\n' && *str != '\0') {
      if (word && word_cur >= word_size) {
         if (word_size > 0 && word)
            word[word_size-1] = '\0';
         return word_cur;
      }
      if (word)
         word[word_cur] = *str;
      word_cur++;
      str++;
      len++;
   }
   if (word_cur >= word_size)
      word_cur--;
   if (word)
      word[word_cur] = '\0';
   return len;
}